

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,TableIndexField *field,void *data)

{
  pointer pSVar1;
  TableIndexField *in_RDX;
  CodeGenerateVisitor *in_RSI;
  undefined8 in_RDI;
  CodeGenerateVisitor *unaff_retaddr;
  ExpVarData_conflict exp_var_data;
  int key_register;
  int table_register;
  TableFieldData *field_data;
  ExpVarData local_30;
  int line;
  TableIndexField *field_00;
  
  line = *(int *)&(in_RDX->super_SyntaxTree)._vptr_SyntaxTree;
  field_00 = in_RDX;
  local_30._8_4_ = GenerateRegisterId(unaff_retaddr);
  ExpVarData::ExpVarData(&local_30,local_30._8_4_,local_30._8_4_ + 1);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1a3e8d);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&local_30);
  SetTableFieldValue<luna::TableIndexField>
            (in_RSI,field_00,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,line);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(TableIndexField *field, void *data)
    {
        auto field_data = static_cast<TableFieldData *>(data);
        auto table_register = field_data->table_register_;

        // Load key
        auto key_register = GenerateRegisterId();
        ExpVarData exp_var_data{ key_register, key_register + 1 };
        field->index_->Accept(this, &exp_var_data);

        SetTableFieldValue(field, table_register, key_register, field->line_);
    }